

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O0

bool printMessagePreamble(MessageType t,ostream *msg)

{
  ostream *msg_local;
  MessageType t_local;
  
  if (t == FATAL_ERROR) {
    std::operator<<(msg,"CMake Error");
  }
  else if (t == INTERNAL_ERROR) {
    std::operator<<(msg,"CMake Internal Error (please report a bug)");
  }
  else if (t == LOG) {
    std::operator<<(msg,"CMake Debug Log");
  }
  else if (t == DEPRECATION_ERROR) {
    std::operator<<(msg,"CMake Deprecation Error");
  }
  else if (t == DEPRECATION_WARNING) {
    std::operator<<(msg,"CMake Deprecation Warning");
  }
  else if (t == AUTHOR_WARNING) {
    std::operator<<(msg,"CMake Warning (dev)");
  }
  else if (t == AUTHOR_ERROR) {
    std::operator<<(msg,"CMake Error (dev)");
  }
  else {
    std::operator<<(msg,"CMake Warning");
  }
  return true;
}

Assistant:

static bool printMessagePreamble(cmake::MessageType t, std::ostream& msg)
{
  // Construct the message header.
  if (t == cmake::FATAL_ERROR) {
    msg << "CMake Error";
  } else if (t == cmake::INTERNAL_ERROR) {
    msg << "CMake Internal Error (please report a bug)";
  } else if (t == cmake::LOG) {
    msg << "CMake Debug Log";
  } else if (t == cmake::DEPRECATION_ERROR) {
    msg << "CMake Deprecation Error";
  } else if (t == cmake::DEPRECATION_WARNING) {
    msg << "CMake Deprecation Warning";
  } else if (t == cmake::AUTHOR_WARNING) {
    msg << "CMake Warning (dev)";
  } else if (t == cmake::AUTHOR_ERROR) {
    msg << "CMake Error (dev)";
  } else {
    msg << "CMake Warning";
  }
  return true;
}